

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountAggregate.cpp
# Opt level: O3

void __thiscall CountAggregate::~CountAggregate(CountAggregate *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pdVar2;
  pointer pcVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer ppiVar6;
  ulong uVar7;
  ulong uVar8;
  
  (this->super_MachineLearningModel)._vptr_MachineLearningModel =
       (_func_int **)&PTR__CountAggregate_00143bb0;
  if (dfdb::params::NUM_OF_FEATURES != 0) {
    uVar7 = 0;
    uVar8 = dfdb::params::NUM_OF_FEATURES;
    do {
      if (this->_features[uVar7] != (int *)0x0) {
        operator_delete__(this->_features[uVar7]);
        uVar8 = dfdb::params::NUM_OF_FEATURES;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar8);
  }
  if (this->_features != (int **)0x0) {
    operator_delete__(this->_features);
  }
  pvVar4 = (this->_aggregateRegister).
           super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (this->_aggregateRegister).
           super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 != pvVar4) {
    uVar8 = 0;
    do {
      ppiVar6 = pvVar4[uVar8].super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pvVar4[uVar8].super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppiVar6) {
        uVar7 = 0;
        do {
          if (ppiVar6[uVar7] != (int *)0x0) {
            operator_delete__(ppiVar6[uVar7]);
            pvVar4 = (this->_aggregateRegister).
                     super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar7 = uVar7 + 1;
          ppiVar6 = pvVar4[uVar8].super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar7 < (ulong)((long)pvVar4[uVar8].
                                       super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)ppiVar6 >> 3));
        pvVar5 = (this->_aggregateRegister).
                 super__Vector_base<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(((long)pvVar5 - (long)pvVar4 >> 3) * -0x5555555555555555));
  }
  if (this->_numberOfAggregatesPerNode != (int *)0x0) {
    operator_delete__(this->_numberOfAggregatesPerNode);
  }
  if (this->_degreeOfLocalAggregates != (int *)0x0) {
    operator_delete__(this->_degreeOfLocalAggregates);
  }
  if (dfdb::params::NUM_OF_ATTRIBUTES != 0) {
    uVar8 = 0;
    do {
      if (uVar8 != (long)((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->_root->_id) {
        if (this->aggPlaceholder[uVar8] != (int *)0x0) {
          operator_delete__(this->aggPlaceholder[uVar8]);
        }
        if (this->lineagePlaceholder[uVar8] != (int *)0x0) {
          operator_delete__(this->lineagePlaceholder[uVar8]);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < dfdb::params::NUM_OF_ATTRIBUTES);
  }
  if (this->aggPlaceholder != (int **)0x0) {
    operator_delete__(this->aggPlaceholder);
  }
  if (this->lineagePlaceholder != (int **)0x0) {
    operator_delete__(this->lineagePlaceholder);
  }
  if (this->_cofactorMatrix != (ResultType *)0x0) {
    operator_delete__(this->_cofactorMatrix);
  }
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&this->_lineageRegister);
  std::
  vector<std::vector<int_*,_std::allocator<int_*>_>,_std::allocator<std::vector<int_*,_std::allocator<int_*>_>_>_>
  ::~vector(&this->_aggregateRegister);
  p_Var1 = (this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->_fade).super___shared_ptr<Fade,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pdVar2 = (this->_fadeAggregates).categoricalAggregates.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  p_Var1 = (this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  pcVar3 = (this->_pathToFiles)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->_pathToFiles).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

CountAggregate::~CountAggregate()
{
    for (size_t i = 0; i < NUM_OF_FEATURES; ++i)
        delete[] _features[i];
    delete[] _features;

    for (size_t i = 0; i < _aggregateRegister.size(); ++i)
        for (size_t j = 0; j < _aggregateRegister[i].size(); ++j)
            delete[] _aggregateRegister[i][j];

    delete[] _numberOfAggregatesPerNode;
    delete[] _degreeOfLocalAggregates;
    
    for (size_t i = 0; i < NUM_OF_ATTRIBUTES; ++i)
    {
        if (i != (size_t) _dTree->_root->_id)
        {
            delete[] aggPlaceholder[i];
            delete[] lineagePlaceholder[i];
        }
    }

    delete[] aggPlaceholder;
    delete[] lineagePlaceholder;
    delete[] _cofactorMatrix;
}